

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoleculeStamp.cpp
# Opt level: O1

bool __thiscall
OpenMD::MoleculeStamp::addInversionStamp(MoleculeStamp *this,InversionStamp *inversion)

{
  pointer *pppIVar1;
  iterator __position;
  InversionStamp *local_8;
  
  __position._M_current =
       (this->inversionStamps_).
       super__Vector_base<OpenMD::InversionStamp_*,_std::allocator<OpenMD::InversionStamp_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->inversionStamps_).
      super__Vector_base<OpenMD::InversionStamp_*,_std::allocator<OpenMD::InversionStamp_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_8 = inversion;
    std::vector<OpenMD::InversionStamp*,std::allocator<OpenMD::InversionStamp*>>::
    _M_realloc_insert<OpenMD::InversionStamp*const&>
              ((vector<OpenMD::InversionStamp*,std::allocator<OpenMD::InversionStamp*>> *)
               &this->inversionStamps_,__position,&local_8);
  }
  else {
    *__position._M_current = inversion;
    pppIVar1 = &(this->inversionStamps_).
                super__Vector_base<OpenMD::InversionStamp_*,_std::allocator<OpenMD::InversionStamp_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppIVar1 = *pppIVar1 + 1;
  }
  return true;
}

Assistant:

bool MoleculeStamp::addInversionStamp(InversionStamp* inversion) {
    inversionStamps_.push_back(inversion);
    return true;
  }